

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

CopyConst<char,_ElementType<0UL>_> * __thiscall
absl::lts_20240722::container_internal::internal_layout::
LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
::Pointer<0ul,char>(LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                    *this,char *p)

{
  size_t sVar1;
  size_t alignment;
  char *p_local;
  LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,_std::atomic<void_*>,_std::atomic<google::protobuf::internal::SerialArena_*>_>,_std::integer_sequence<unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
  *this_local;
  
  if (((ulong)p & 7) == 0) {
    sVar1 = LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,_std::atomic<void_*>,_std::atomic<google::protobuf::internal::SerialArena_*>_>,_std::integer_sequence<unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
            ::Offset<0UL,_0>((LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,_std::atomic<void_*>,_std::atomic<google::protobuf::internal::SerialArena_*>_>,_std::integer_sequence<unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                              *)this);
    return (CopyConst<char,_ElementType<0UL>_> *)(p + sVar1);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2>, std::integer_sequence<unsigned long, 0, 1, 2>, std::integer_sequence<unsigned long, 0, 1, 2>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long>, RuntimeSizeSeq = std::integer_sequence<unsigned long, 0, 1, 2>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2>, N = 0UL, Char = char]"
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const {
    using C = typename std::remove_const<Char>::type;
    static_assert(
        std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
            std::is_same<C, signed char>(),
        "The argument must be a pointer to [const] [signed|unsigned] char");
    constexpr size_t alignment = Alignment();
    (void)alignment;
    assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
    return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
  }